

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *poVar1;
  SourceLineInfo local_28;
  Colour local_11;
  AssertionPrinter *pAStack_10;
  Colour colourGuard;
  AssertionPrinter *this_local;
  
  pAStack_10 = this;
  Colour::Colour(&local_11,FileName);
  poVar1 = this->stream;
  local_28 = AssertionResult::getSourceInfo(this->result);
  poVar1 = Catch::operator<<(poVar1,&local_28);
  std::operator<<(poVar1,": ");
  Colour::~Colour(&local_11);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ": ";
            }